

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O0

void __thiscall
FPathTraverse::AddThingIntercepts
          (FPathTraverse *this,int bx,int by,FBlockThingsIterator *it,bool compatible)

{
  int iVar1;
  int iVar2;
  AActor *this_00;
  anon_union_8_2_50eab53d_for_d aVar3;
  double dVar4;
  undefined1 local_110 [8];
  intercept_t newintercept_2;
  bool tracepositive;
  double frac_1;
  divline_t dl;
  int s2;
  int s1;
  double y2;
  double x2;
  double y1;
  double x1;
  intercept_t newintercept_1;
  intercept_t newintercept;
  double frac2;
  double frac;
  undefined1 auStack_58 [4];
  int i;
  divline_t line;
  int numfronts;
  AActor *thing;
  bool compatible_local;
  FBlockThingsIterator *it_local;
  int by_local;
  int bx_local;
  FPathTraverse *this_local;
  
  FBlockThingsIterator::SwitchBlock(it,bx,by);
  do {
    while( true ) {
      this_00 = FBlockThingsIterator::Next(it,compatible);
      if (this_00 == (AActor *)0x0) {
        return;
      }
      line.dy._4_4_ = 0;
      if (!compatible) break;
      newintercept_2.d._7_1_ = 0.0 < (this->trace).dx * (this->trace).dy;
      if ((bool)newintercept_2.d._7_1_) {
        dVar4 = AActor::X(this_00);
        y1 = dVar4 - this_00->radius;
        dVar4 = AActor::Y(this_00);
        x2 = dVar4 + this_00->radius;
        dVar4 = AActor::X(this_00);
        y2 = dVar4 + this_00->radius;
        _s2 = AActor::Y(this_00);
        _s2 = _s2 - this_00->radius;
      }
      else {
        dVar4 = AActor::X(this_00);
        y1 = dVar4 - this_00->radius;
        dVar4 = AActor::Y(this_00);
        x2 = dVar4 - this_00->radius;
        dVar4 = AActor::X(this_00);
        y2 = dVar4 + this_00->radius;
        _s2 = AActor::Y(this_00);
        _s2 = _s2 + this_00->radius;
      }
      dl.dy._4_4_ = P_PointOnDivlineSide(y1,x2,&this->trace);
      dl.dy._0_4_ = P_PointOnDivlineSide(y2,_s2,&this->trace);
      if (dl.dy._4_4_ != dl.dy._0_4_) {
        frac_1 = y1;
        dl.x = x2;
        dl.y = y2 - y1;
        dl.dx = _s2 - x2;
        dVar4 = P_InterceptVector(&this->trace,(divline_t *)&frac_1);
        if (this->Startfrac <= dVar4) {
          newintercept_2.frac._0_1_ = 0;
          newintercept_2.frac._1_1_ = 0;
          local_110 = (undefined1  [8])dVar4;
          newintercept_2._8_8_ = this_00;
          TArray<intercept_t,_intercept_t>::Push(&intercepts,(intercept_t *)local_110);
        }
      }
    }
    for (frac._4_4_ = 0; frac._4_4_ < 4; frac._4_4_ = frac._4_4_ + 1) {
      switch(frac._4_4_) {
      case 0:
        dVar4 = AActor::Y(this_00);
        line.x = dVar4 + this_00->radius;
        if (line.x <= (this->trace).y) {
          _auStack_58 = AActor::X(this_00);
          _auStack_58 = _auStack_58 + this_00->radius;
          line.y = -this_00->radius * 2.0;
          line.dx = 0.0;
          break;
        }
        goto LAB_0059d717;
      case 1:
        _auStack_58 = AActor::X(this_00);
        _auStack_58 = _auStack_58 + this_00->radius;
        if ((this->trace).x < _auStack_58) goto LAB_0059d717;
        dVar4 = AActor::Y(this_00);
        line.x = dVar4 - this_00->radius;
        line.y = 0.0;
        line.dx = this_00->radius * 2.0;
        break;
      case 2:
        dVar4 = AActor::Y(this_00);
        line.x = dVar4 - this_00->radius;
        if (line.x < (this->trace).y) goto LAB_0059d717;
        _auStack_58 = AActor::X(this_00);
        _auStack_58 = _auStack_58 - this_00->radius;
        line.y = this_00->radius * 2.0;
        line.dx = 0.0;
        break;
      case 3:
        _auStack_58 = AActor::X(this_00);
        _auStack_58 = _auStack_58 - this_00->radius;
        if (_auStack_58 < (this->trace).x) goto LAB_0059d717;
        dVar4 = AActor::Y(this_00);
        line.x = dVar4 + this_00->radius;
        line.y = 0.0;
        line.dx = this_00->radius * -2.0;
      }
      line.dy._4_4_ = line.dy._4_4_ + 1;
      iVar1 = P_PointOnDivlineSide(_auStack_58,line.x,&this->trace);
      iVar2 = P_PointOnDivlineSide(_auStack_58 + line.y,line.x + line.dx,&this->trace);
      if (iVar1 != iVar2) {
        aVar3 = (anon_union_8_2_50eab53d_for_d)
                P_InterceptVector(&this->trace,(divline_t *)auStack_58);
        if (this->Startfrac <= (double)aVar3) {
LAB_0059d6e9:
          newintercept_1.d = aVar3;
          TArray<intercept_t,_intercept_t>::Push(&intercepts,(intercept_t *)&newintercept_1.d);
          break;
        }
        if (0.0 < this->Startfrac) {
          switch(frac._4_4_) {
          case 0:
            line.x = line.x - this_00->radius * 2.0;
            break;
          case 1:
            _auStack_58 = _auStack_58 - this_00->radius * 2.0;
            break;
          case 2:
            line.x = this_00->radius * 2.0 + line.x;
            break;
          case 3:
            _auStack_58 = this_00->radius * 2.0 + _auStack_58;
          }
          dVar4 = P_InterceptVector(&this->trace,(divline_t *)auStack_58);
          if (this->Startfrac <= dVar4) goto LAB_0059d6e9;
        }
      }
LAB_0059d717:
    }
    if (line.dy._4_4_ == 0) {
      x1 = 0.0;
      newintercept_1.frac._0_1_ = 0;
      newintercept_1.frac._1_1_ = 0;
      newintercept_1._8_8_ = this_00;
      TArray<intercept_t,_intercept_t>::Push(&intercepts,(intercept_t *)&x1);
    }
  } while( true );
}

Assistant:

void FPathTraverse::AddThingIntercepts (int bx, int by, FBlockThingsIterator &it, bool compatible)
{
	AActor *thing;

	it.SwitchBlock(bx, by);
	while ((thing = it.Next(compatible)))
	{
		int numfronts = 0;
		divline_t line;
		int i;


		if (!compatible)
		{
			// [RH] Don't check a corner to corner crossection for hit.
			// Instead, check against the actual bounding box (but not if compatibility optioned.)

			// There's probably a smarter way to determine which two sides
			// of the thing face the trace than by trying all four sides...
			for (i = 0; i < 4; ++i)
			{
				switch (i)
				{
				case 0:		// Top edge
					line.y = thing->Y() + thing->radius;
					if (trace.y < line.y) continue;
					line.x = thing->X() + thing->radius;
					line.dx = -thing->radius * 2;
					line.dy = 0;
					break;

				case 1:		// Right edge
					line.x = thing->X() + thing->radius;
					if (trace.x < line.x) continue;
					line.y = thing->Y() - thing->radius;
					line.dx = 0;
					line.dy = thing->radius * 2;
					break;

				case 2:		// Bottom edge
					line.y = thing->Y() - thing->radius;
					if (trace.y > line.y) continue;
					line.x = thing->X() - thing->radius;
					line.dx = thing->radius * 2;
					line.dy = 0;
					break;

				case 3:		// Left edge
					line.x = thing->X() - thing->radius;
					if (trace.x > line.x) continue;
					line.y = thing->Y() + thing->radius;
					line.dx = 0;
					line.dy = thing->radius * -2;
					break;
				}
				// Check if this side is facing the trace origin
				numfronts++;

				// If it is, see if the trace crosses it
				if (P_PointOnDivlineSide (line.x, line.y, &trace) !=
					P_PointOnDivlineSide (line.x + line.dx, line.y + line.dy, &trace))
				{
					// It's a hit
					double frac = P_InterceptVector (&trace, &line);
					if (frac < Startfrac)
					{ // behind source
						if (Startfrac > 0)
						{
							// check if the trace starts within this actor
							switch (i)
							{
							case 0:
								line.y -= 2 * thing->radius;
								break;

							case 1:
								line.x -= 2 * thing->radius;
								break;

							case 2:
								line.y += 2 * thing->radius;
								break;

							case 3:
								line.x += 2 * thing->radius;
								break;
							}
							double frac2 = P_InterceptVector(&trace, &line);
							if (frac2 >= Startfrac) goto addit;
						}
						continue;
					}
				addit:
					intercept_t newintercept;
					newintercept.frac = frac;
					newintercept.isaline = false;
					newintercept.done = false;
					newintercept.d.thing = thing;
					intercepts.Push (newintercept);
					break;
				}
			}

			// If none of the sides was facing the trace, then the trace
			// must have started inside the box, so add it as an intercept.
			if (numfronts == 0)
			{
				intercept_t newintercept;
				newintercept.frac = 0;
				newintercept.isaline = false;
				newintercept.done = false;
				newintercept.d.thing = thing;
				intercepts.Push (newintercept);
			}
		}
		else
		{
			// Old code for compatibility purposes
			double 		x1, y1, x2, y2;
			int 			s1, s2;
			divline_t		dl;
			double 		frac;
				
			bool tracepositive = (trace.dx * trace.dy)>0;
						
			// check a corner to corner crossection for hit
			if (tracepositive)
			{
				x1 = thing->X() - thing->radius;
				y1 = thing->Y() + thing->radius;
						
				x2 = thing->X() + thing->radius;
				y2 = thing->Y() - thing->radius;					
			}
			else
			{
				x1 = thing->X() - thing->radius;
				y1 = thing->Y() - thing->radius;
						
				x2 = thing->X() + thing->radius;
				y2 = thing->Y() + thing->radius;					
			}
			
			s1 = P_PointOnDivlineSide (x1, y1, &trace);
			s2 = P_PointOnDivlineSide (x2, y2, &trace);

			if (s1 != s2)
			{
				dl.x = x1;
				dl.y = y1;
				dl.dx = x2-x1;
				dl.dy = y2-y1;
				
				frac = P_InterceptVector (&trace, &dl);

				if (frac >= Startfrac)
				{
					intercept_t newintercept;
					newintercept.frac = frac;
					newintercept.isaline = false;
					newintercept.done = false;
					newintercept.d.thing = thing;
					intercepts.Push (newintercept);
				}
			}
		}
	}
}